

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeCommit(sqlite3 *db,Vdbe *p)

{
  long lVar1;
  Btree *pBVar2;
  bool bVar3;
  i64 id;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  bool local_ac;
  Btree *pBt_5;
  Btree *pBt_4;
  char *zFile;
  Btree *pBt_3;
  u32 iRandom;
  int nMainFile;
  int retryCount;
  int res;
  i64 offset;
  sqlite3_file *pSuperJrnl;
  char *zMainFile;
  char *zSuper;
  sqlite3_vfs *pVfs;
  Btree *pBt_2;
  Btree *pBt_1;
  Pager *pPager;
  Btree *pBt;
  int needXcommit;
  int rc;
  int nTrans;
  int i;
  Vdbe *p_local;
  sqlite3 *db_local;
  
  needXcommit = 0;
  pBt._4_4_ = 0;
  pBt._0_4_ = 0;
  _nTrans = p;
  p_local = (Vdbe *)db;
  pBt._4_4_ = sqlite3VtabSync(db,p);
  rc = 0;
  while( true ) {
    bVar3 = false;
    if (pBt._4_4_ == 0) {
      bVar3 = rc < p_local->nCursor;
    }
    if (!bVar3) break;
    pPager = *(Pager **)(*(long *)&p_local->nVar + (long)rc * 0x20 + 8);
    iVar4 = sqlite3BtreeTxnState((Btree *)pPager);
    if (iVar4 == 2) {
      pBt._0_4_ = 1;
      sqlite3BtreeEnter((Btree *)pPager);
      pBt_1 = (Btree *)sqlite3BtreePager((Btree *)pPager);
      if (((*(char *)(*(long *)&p_local->nVar + (long)rc * 0x20 + 0x10) != '\x01') &&
          (iVar4 = sqlite3PagerGetJournalMode((Pager *)pBt_1), "\x01\x01"[iVar4] != '\0')) &&
         (iVar4 = sqlite3PagerIsMemdb((Pager *)pBt_1), iVar4 == 0)) {
        needXcommit = needXcommit + 1;
      }
      pBt._4_4_ = sqlite3PagerExclusiveLock((Pager *)pBt_1);
      sqlite3BtreeLeave((Btree *)pPager);
    }
    rc = rc + 1;
  }
  if (pBt._4_4_ != 0) {
    return pBt._4_4_;
  }
  if (((int)pBt != 0) && (lVar1._0_4_ = p_local->nFrame, lVar1._4_4_ = p_local->expmask, lVar1 != 0)
     ) {
    iVar4 = (**(code **)&p_local->nFrame)(p_local->pDelFrame);
    if (iVar4 != 0) {
      return 0x213;
    }
    pBt._4_4_ = 0;
  }
  pcVar6 = sqlite3BtreeGetFilename(*(Btree **)(*(long *)&p_local->nVar + 8));
  iVar4 = sqlite3Strlen30(pcVar6);
  if ((iVar4 == 0) || (needXcommit < 2)) {
    rc = 0;
    while( true ) {
      bVar3 = false;
      if (pBt._4_4_ == 0) {
        bVar3 = rc < p_local->nCursor;
      }
      if (!bVar3) break;
      pBt_2 = *(Btree **)(*(long *)&p_local->nVar + (long)rc * 0x20 + 8);
      if (pBt_2 != (Btree *)0x0) {
        pBt._4_4_ = sqlite3BtreeCommitPhaseOne(pBt_2,(char *)0x0);
      }
      rc = rc + 1;
    }
    rc = 0;
    while( true ) {
      bVar3 = false;
      if (pBt._4_4_ == 0) {
        bVar3 = rc < p_local->nCursor;
      }
      if (!bVar3) break;
      pVfs = *(sqlite3_vfs **)(*(long *)&p_local->nVar + (long)rc * 0x20 + 8);
      if (pVfs != (sqlite3_vfs *)0x0) {
        pBt._4_4_ = sqlite3BtreeCommitPhaseTwo((Btree *)pVfs,0);
      }
      rc = rc + 1;
    }
    if (pBt._4_4_ == 0) {
      sqlite3VtabCommit((sqlite3 *)p_local);
    }
  }
  else {
    zSuper = (char *)p_local->db;
    zMainFile = (char *)0x0;
    pSuperJrnl = (sqlite3_file *)sqlite3BtreeGetFilename(*(Btree **)(*(long *)&p_local->nVar + 8));
    offset = 0;
    _retryCount = 0;
    iRandom = 0;
    pBt_3._4_4_ = sqlite3Strlen30((char *)pSuperJrnl);
    pcVar6 = sqlite3MPrintf((sqlite3 *)p_local,"%.4c%s%.16c",0,pSuperJrnl);
    if (pcVar6 == (char *)0x0) {
      return 7;
    }
    zMainFile = pcVar6 + 4;
    do {
      if (iRandom != 0) {
        if (100 < (int)iRandom) {
          sqlite3_log(0xd,"MJ delete: %s",zMainFile);
          sqlite3OsDelete((sqlite3_vfs *)zSuper,zMainFile,0);
          break;
        }
        if (iRandom == 1) {
          sqlite3_log(0xd,"MJ collide: %s",zMainFile);
        }
      }
      iRandom = iRandom + 1;
      sqlite3_randomness(4,&pBt_3);
      sqlite3_snprintf(0xd,zMainFile + pBt_3._4_4_,"-mj%06X9%02X",(ulong)((uint)pBt_3 >> 8),
                       (ulong)((uint)pBt_3 & 0xff));
      pBt._4_4_ = sqlite3OsAccess((sqlite3_vfs *)zSuper,zMainFile,0,&nMainFile);
      local_ac = pBt._4_4_ == 0 && nMainFile != 0;
    } while (local_ac);
    if (pBt._4_4_ == 0) {
      pBt._4_4_ = sqlite3OsOpenMalloc((sqlite3_vfs *)zSuper,zMainFile,(sqlite3_file **)&offset,
                                      0x4016,(int *)0x0);
    }
    if (pBt._4_4_ != 0) {
      sqlite3DbFree((sqlite3 *)p_local,zMainFile + -4);
      return pBt._4_4_;
    }
    for (rc = 0; rc < p_local->nCursor; rc = rc + 1) {
      pBVar2 = *(Btree **)(*(long *)&p_local->nVar + (long)rc * 0x20 + 8);
      iVar4 = sqlite3BtreeTxnState(pBVar2);
      if ((iVar4 == 2) &&
         (pcVar6 = sqlite3BtreeGetJournalname(pBVar2), id = offset, pcVar6 != (char *)0x0)) {
        iVar4 = sqlite3Strlen30(pcVar6);
        pBt._4_4_ = sqlite3OsWrite((sqlite3_file *)id,pcVar6,iVar4 + 1,_retryCount);
        iVar4 = sqlite3Strlen30(pcVar6);
        _retryCount = (iVar4 + 1) + _retryCount;
        if (pBt._4_4_ != 0) {
          sqlite3OsCloseFree((sqlite3_file *)offset);
          sqlite3OsDelete((sqlite3_vfs *)zSuper,zMainFile,0);
          sqlite3DbFree((sqlite3 *)p_local,zMainFile + -4);
          return pBt._4_4_;
        }
      }
    }
    uVar5 = sqlite3OsDeviceCharacteristics((sqlite3_file *)offset);
    if (((uVar5 & 0x400) == 0) &&
       (pBt._4_4_ = sqlite3OsSync((sqlite3_file *)offset,2), pBt._4_4_ != 0)) {
      sqlite3OsCloseFree((sqlite3_file *)offset);
      sqlite3OsDelete((sqlite3_vfs *)zSuper,zMainFile,0);
      sqlite3DbFree((sqlite3 *)p_local,zMainFile + -4);
      return pBt._4_4_;
    }
    rc = 0;
    while( true ) {
      bVar3 = false;
      if (pBt._4_4_ == 0) {
        bVar3 = rc < p_local->nCursor;
      }
      if (!bVar3) break;
      pBVar2 = *(Btree **)(*(long *)&p_local->nVar + (long)rc * 0x20 + 8);
      if (pBVar2 != (Btree *)0x0) {
        pBt._4_4_ = sqlite3BtreeCommitPhaseOne(pBVar2,zMainFile);
      }
      rc = rc + 1;
    }
    sqlite3OsCloseFree((sqlite3_file *)offset);
    if (pBt._4_4_ != 0) {
      sqlite3DbFree((sqlite3 *)p_local,zMainFile + -4);
      return pBt._4_4_;
    }
    pBt._4_4_ = sqlite3OsDelete((sqlite3_vfs *)zSuper,zMainFile,1);
    sqlite3DbFree((sqlite3 *)p_local,zMainFile + -4);
    zMainFile = (char *)0x0;
    if (pBt._4_4_ != 0) {
      return pBt._4_4_;
    }
    sqlite3BeginBenignMalloc();
    for (rc = 0; rc < p_local->nCursor; rc = rc + 1) {
      pBVar2 = *(Btree **)(*(long *)&p_local->nVar + (long)rc * 0x20 + 8);
      if (pBVar2 != (Btree *)0x0) {
        sqlite3BtreeCommitPhaseTwo(pBVar2,1);
      }
    }
    sqlite3EndBenignMalloc();
    sqlite3VtabCommit((sqlite3 *)p_local);
  }
  return pBt._4_4_;
}

Assistant:

static int vdbeCommit(sqlite3 *db, Vdbe *p){
  int i;
  int nTrans = 0;  /* Number of databases with an active write-transaction
                   ** that are candidates for a two-phase commit using a
                   ** super-journal */
  int rc = SQLITE_OK;
  int needXcommit = 0;

#ifdef SQLITE_OMIT_VIRTUALTABLE
  /* With this option, sqlite3VtabSync() is defined to be simply
  ** SQLITE_OK so p is not used.
  */
  UNUSED_PARAMETER(p);
#endif

  /* Before doing anything else, call the xSync() callback for any
  ** virtual module tables written in this transaction. This has to
  ** be done before determining whether a super-journal file is
  ** required, as an xSync() callback may add an attached database
  ** to the transaction.
  */
  rc = sqlite3VtabSync(db, p);

  /* This loop determines (a) if the commit hook should be invoked and
  ** (b) how many database files have open write transactions, not
  ** including the temp database. (b) is important because if more than
  ** one database file has an open write transaction, a super-journal
  ** file is required for an atomic commit.
  */
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_WRITE ){
      /* Whether or not a database might need a super-journal depends upon
      ** its journal mode (among other things).  This matrix determines which
      ** journal modes use a super-journal and which do not */
      static const u8 aMJNeeded[] = {
        /* DELETE   */  1,
        /* PERSIST   */ 1,
        /* OFF       */ 0,
        /* TRUNCATE  */ 1,
        /* MEMORY    */ 0,
        /* WAL       */ 0
      };
      Pager *pPager;   /* Pager associated with pBt */
      needXcommit = 1;
      sqlite3BtreeEnter(pBt);
      pPager = sqlite3BtreePager(pBt);
      if( db->aDb[i].safety_level!=PAGER_SYNCHRONOUS_OFF
       && aMJNeeded[sqlite3PagerGetJournalMode(pPager)]
       && sqlite3PagerIsMemdb(pPager)==0
      ){
        assert( i!=1 );
        nTrans++;
      }
      rc = sqlite3PagerExclusiveLock(pPager);
      sqlite3BtreeLeave(pBt);
    }
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* If there are any write-transactions at all, invoke the commit hook */
  if( needXcommit && db->xCommitCallback ){
    rc = db->xCommitCallback(db->pCommitArg);
    if( rc ){
      return SQLITE_CONSTRAINT_COMMITHOOK;
    }
  }

  /* The simple case - no more than one database file (not counting the
  ** TEMP database) has a transaction active.   There is no need for the
  ** super-journal.
  **
  ** If the return value of sqlite3BtreeGetFilename() is a zero length
  ** string, it means the main database is :memory: or a temp file.  In
  ** that case we do not support atomic multi-file commits, so use the
  ** simple case then too.
  */
  if( 0==sqlite3Strlen30(sqlite3BtreeGetFilename(db->aDb[0].pBt))
   || nTrans<=1
  ){
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, 0);
      }
    }

    /* Do the commit only if all databases successfully complete phase 1.
    ** If one of the BtreeCommitPhaseOne() calls fails, this indicates an
    ** IO error while deleting or truncating a journal file. It is unlikely,
    ** but could happen. In this case abandon processing and return the error.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseTwo(pBt, 0);
      }
    }
    if( rc==SQLITE_OK ){
      sqlite3VtabCommit(db);
    }
  }

  /* The complex case - There is a multi-file write-transaction active.
  ** This requires a super-journal file to ensure the transaction is
  ** committed atomically.
  */
#ifndef SQLITE_OMIT_DISKIO
  else{
    sqlite3_vfs *pVfs = db->pVfs;
    char *zSuper = 0;   /* File-name for the super-journal */
    char const *zMainFile = sqlite3BtreeGetFilename(db->aDb[0].pBt);
    sqlite3_file *pSuperJrnl = 0;
    i64 offset = 0;
    int res;
    int retryCount = 0;
    int nMainFile;

    /* Select a super-journal file name */
    nMainFile = sqlite3Strlen30(zMainFile);
    zSuper = sqlite3MPrintf(db, "%.4c%s%.16c", 0,zMainFile,0);
    if( zSuper==0 ) return SQLITE_NOMEM_BKPT;
    zSuper += 4;
    do {
      u32 iRandom;
      if( retryCount ){
        if( retryCount>100 ){
          sqlite3_log(SQLITE_FULL, "MJ delete: %s", zSuper);
          sqlite3OsDelete(pVfs, zSuper, 0);
          break;
        }else if( retryCount==1 ){
          sqlite3_log(SQLITE_FULL, "MJ collide: %s", zSuper);
        }
      }
      retryCount++;
      sqlite3_randomness(sizeof(iRandom), &iRandom);
      sqlite3_snprintf(13, &zSuper[nMainFile], "-mj%06X9%02X",
                               (iRandom>>8)&0xffffff, iRandom&0xff);
      /* The antipenultimate character of the super-journal name must
      ** be "9" to avoid name collisions when using 8+3 filenames. */
      assert( zSuper[sqlite3Strlen30(zSuper)-3]=='9' );
      sqlite3FileSuffix3(zMainFile, zSuper);
      rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
    }while( rc==SQLITE_OK && res );
    if( rc==SQLITE_OK ){
      /* Open the super-journal. */
      rc = sqlite3OsOpenMalloc(pVfs, zSuper, &pSuperJrnl,
          SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|
          SQLITE_OPEN_EXCLUSIVE|SQLITE_OPEN_SUPER_JOURNAL, 0
      );
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Write the name of each database file in the transaction into the new
    ** super-journal file. If an error occurs at this point close
    ** and delete the super-journal file. All the individual journal files
    ** still have 'null' as the super-journal pointer, so they will roll
    ** back independently if a failure occurs.
    */
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_WRITE ){
        char const *zFile = sqlite3BtreeGetJournalname(pBt);
        if( zFile==0 ){
          continue;  /* Ignore TEMP and :memory: databases */
        }
        assert( zFile[0]!=0 );
        rc = sqlite3OsWrite(pSuperJrnl, zFile, sqlite3Strlen30(zFile)+1,offset);
        offset += sqlite3Strlen30(zFile)+1;
        if( rc!=SQLITE_OK ){
          sqlite3OsCloseFree(pSuperJrnl);
          sqlite3OsDelete(pVfs, zSuper, 0);
          sqlite3DbFree(db, zSuper-4);
          return rc;
        }
      }
    }

    /* Sync the super-journal file. If the IOCAP_SEQUENTIAL device
    ** flag is set this is not required.
    */
    if( 0==(sqlite3OsDeviceCharacteristics(pSuperJrnl)&SQLITE_IOCAP_SEQUENTIAL)
     && SQLITE_OK!=(rc = sqlite3OsSync(pSuperJrnl, SQLITE_SYNC_NORMAL))
    ){
      sqlite3OsCloseFree(pSuperJrnl);
      sqlite3OsDelete(pVfs, zSuper, 0);
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Sync all the db files involved in the transaction. The same call
    ** sets the super-journal pointer in each individual journal. If
    ** an error occurs here, do not delete the super-journal file.
    **
    ** If the error occurs during the first call to
    ** sqlite3BtreeCommitPhaseOne(), then there is a chance that the
    ** super-journal file will be orphaned. But we cannot delete it,
    ** in case the super-journal file name was written into the journal
    ** file before the failure occurred.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, zSuper);
      }
    }
    sqlite3OsCloseFree(pSuperJrnl);
    assert( rc!=SQLITE_BUSY );
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Delete the super-journal file. This commits the transaction. After
    ** doing this the directory is synced again before any individual
    ** transaction files are deleted.
    */
    rc = sqlite3OsDelete(pVfs, zSuper, 1);
    sqlite3DbFree(db, zSuper-4);
    zSuper = 0;
    if( rc ){
      return rc;
    }

    /* All files and directories have already been synced, so the following
    ** calls to sqlite3BtreeCommitPhaseTwo() are only closing files and
    ** deleting or truncating journals. If something goes wrong while
    ** this is happening we don't really care. The integrity of the
    ** transaction is already guaranteed, but some stray 'cold' journals
    ** may be lying around. Returning an error code won't help matters.
    */
    disable_simulated_io_errors();
    sqlite3BeginBenignMalloc();
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        sqlite3BtreeCommitPhaseTwo(pBt, 1);
      }
    }
    sqlite3EndBenignMalloc();
    enable_simulated_io_errors();

    sqlite3VtabCommit(db);
  }
#endif

  return rc;
}